

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  App app;
  string local_208;
  App local_1e8;
  
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"...","");
  CLI::App::App(&local_1e8,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  setup_subcommand_a(&local_1e8);
  local_1e8.require_subcommand_min_ = 1;
  local_1e8.require_subcommand_max_ = 0;
  CLI::App::parse(&local_1e8,argc,argv);
  CLI::App::~App(&local_1e8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::App app{"..."};

    // Call the setup functions for the subcommands.
    // They are kept alive by a shared pointer in the
    // lambda function held by CLI11
    setup_subcommand_a(app);

    // Make sure we get at least one subcommand
    app.require_subcommand();

    // More setup if needed, i.e., other subcommands etc.

    CLI11_PARSE(app, argc, argv);

    return 0;
}